

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::CoverpointSyntax::CoverpointSyntax
          (CoverpointSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          DataTypeSyntax *type,NamedLabelSyntax *label,Token coverpoint,ExpressionSyntax *expr,
          CoverageIffClauseSyntax *iff,Token openBrace,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token closeBrace,Token emptySemi)

{
  pointer ppMVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  DataTypeSyntax *pDVar5;
  ExpressionSyntax *pEVar6;
  long lVar7;
  undefined8 uVar8;
  DataTypeSyntax *local_38;
  
  uVar8 = coverpoint._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,Coverpoint,attributes);
  local_38 = type;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,&local_38);
  this->label = label;
  (this->coverpoint).kind = (short)uVar8;
  (this->coverpoint).field_0x2 = (char)((ulong)uVar8 >> 0x10);
  (this->coverpoint).numFlags = (NumericTokenFlags)(char)((ulong)uVar8 >> 0x18);
  (this->coverpoint).rawLen = (int)((ulong)uVar8 >> 0x20);
  (this->coverpoint).info = coverpoint.info;
  local_38 = (DataTypeSyntax *)expr;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->expr,
             (ExpressionSyntax **)&local_38);
  this->iff = iff;
  (this->openBrace).kind = openBrace.kind;
  (this->openBrace).field_0x2 = openBrace._2_1_;
  (this->openBrace).numFlags = (NumericTokenFlags)openBrace.numFlags.raw;
  (this->openBrace).rawLen = openBrace.rawLen;
  (this->openBrace).info = openBrace.info;
  SVar3 = (members->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
       (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar2 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar2;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473020;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  (this->emptySemi).kind = emptySemi.kind;
  (this->emptySemi).field_0x2 = emptySemi._2_1_;
  (this->emptySemi).numFlags = (NumericTokenFlags)emptySemi.numFlags.raw;
  (this->emptySemi).rawLen = emptySemi.rawLen;
  (this->emptySemi).info = emptySemi.info;
  pDVar5 = not_null<slang::syntax::DataTypeSyntax_*>::get(&this->type);
  (pDVar5->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->label != (NamedLabelSyntax *)0x0) {
    (this->label->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr);
  (pEVar6->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->iff != (CoverageIffClauseSyntax *)0x0) {
    (this->iff->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  for (lVar7 = 0; sVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
    **(undefined8 **)((long)ppMVar1 + lVar7) = this;
  }
  return;
}

Assistant:

CoverpointSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, DataTypeSyntax& type, NamedLabelSyntax* label, Token coverpoint, ExpressionSyntax& expr, CoverageIffClauseSyntax* iff, Token openBrace, const SyntaxList<MemberSyntax>& members, Token closeBrace, Token emptySemi) :
        MemberSyntax(SyntaxKind::Coverpoint, attributes), type(&type), label(label), coverpoint(coverpoint), expr(&expr), iff(iff), openBrace(openBrace), members(members), closeBrace(closeBrace), emptySemi(emptySemi) {
        this->type->parent = this;
        if (this->label) this->label->parent = this;
        this->expr->parent = this;
        if (this->iff) this->iff->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }